

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Statement * __thiscall Parser::simpStmt(Parser *this)

{
  code *pcVar1;
  bool bVar2;
  CallStatement *callStatement;
  ArrayOps *arrayOperator;
  AssignmentStatement *assignmentStatement;
  Token op;
  ExprNode *id;
  ReturnStatement *returnStatement;
  PrintStatement *printStatement;
  undefined1 local_88 [8];
  Token tok;
  Parser *this_local;
  
  tok._string.field_2._8_8_ = this;
  Tokenizer::getToken((Token *)local_88,this->tokenizer);
  Tokenizer::ungetToken(this->tokenizer);
  bVar2 = Token::isPrint((Token *)local_88);
  if (bVar2) {
    Tokenizer::ungetToken(this->tokenizer);
    this_local = (Parser *)printStmt(this);
    goto LAB_0010ac5a;
  }
  bVar2 = Token::isReturn((Token *)local_88);
  if (bVar2) {
    this_local = (Parser *)returnStmt(this);
    goto LAB_0010ac5a;
  }
  bVar2 = Token::isName((Token *)local_88);
  if (!bVar2) {
    this_local = (Parser *)0x0;
    goto LAB_0010ac5a;
  }
  op._string.field_2._8_8_ = variableID(this);
  Tokenizer::getToken((Token *)&assignmentStatement,this->tokenizer);
  Tokenizer::ungetToken(this->tokenizer);
  bVar2 = Token::isAssignmentOperator((Token *)&assignmentStatement);
  if (bVar2) {
LAB_0010aaef:
    this_local = (Parser *)assignStmt(this,(ExprNode *)op._string.field_2._8_8_);
    bVar2 = true;
  }
  else {
    bVar2 = Token::isOpenBrace((Token *)&assignmentStatement);
    if (bVar2) goto LAB_0010aaef;
    bVar2 = Token::isDot((Token *)&assignmentStatement);
    if (bVar2) {
      this_local = (Parser *)arrayOps(this,(ExprNode *)op._string.field_2._8_8_);
      bVar2 = true;
    }
    else {
      bVar2 = Token::isOpenParen((Token *)&assignmentStatement);
      if (bVar2) {
        this_local = (Parser *)callStmt(this,(ExprNode *)op._string.field_2._8_8_);
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
    }
  }
  Token::~Token((Token *)&assignmentStatement);
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
LAB_0010ac5a:
  Token::~Token((Token *)local_88);
  return (Statement *)this_local;
}

Assistant:

Statement *Parser::simpStmt() {
    // stimple_stmt: (print_stmt | assign_stmt | array_ops | call_stmt | return_stmt) NEWLINE

    Token tok = tokenizer.getToken();
    tokenizer.ungetToken();
    if (tok.isPrint()){
        tokenizer.ungetToken();
        PrintStatement *printStatement = printStmt();
        return printStatement;
    } else if (tok.isReturn()){
        ReturnStatement *returnStatement = returnStmt();
        return returnStatement;
    }else if(tok.isName()) {
        ExprNode *id = variableID();
        Token op = tokenizer.getToken();
        tokenizer.ungetToken();
        if(op.isAssignmentOperator() || op.isOpenBrace()) {
            AssignmentStatement *assignmentStatement = assignStmt(id);
            return assignmentStatement;
        } else if(op.isDot()){
            ArrayOps *arrayOperator = arrayOps(id);
            return arrayOperator;
        } else if(op.isOpenParen()){
            CallStatement *callStatement = callStmt(id);
            return callStatement;
        }

    } else return nullptr;


}